

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::MemoryDataParameter::ByteSizeLong(MemoryDataParameter *this)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  MemoryDataParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = MemoryDataParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    bVar1 = has_batch_size(this);
    if (bVar1) {
      uVar2 = batch_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_channels(this);
    if (bVar1) {
      uVar2 = channels(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_height(this);
    if (bVar1) {
      uVar2 = height(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_width(this);
    if (bVar1) {
      uVar2 = width(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t MemoryDataParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.MemoryDataParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 15u) {
    // optional uint32 batch_size = 1;
    if (has_batch_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batch_size());
    }

    // optional uint32 channels = 2;
    if (has_channels()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->channels());
    }

    // optional uint32 height = 3;
    if (has_height()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->height());
    }

    // optional uint32 width = 4;
    if (has_width()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->width());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}